

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket-rpc.c++
# Opt level: O2

Promise<void> __thiscall
capnp::WebSocketMessageStream::writeMessage
          (WebSocketMessageStream *this,ArrayPtr<const_int> fds,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_capnp::word> *in_R9;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  Own<kj::VectorOutputStream,_std::nullptr_t> stream;
  undefined1 local_40 [8];
  Own<kj::VectorOutputStream,_std::nullptr_t> local_38;
  
  pAVar2 = segments.ptr;
  segments_01.size_ = (size_t)in_R9;
  segments_01.ptr = (ArrayPtr<const_capnp::word> *)segments.size_;
  sVar1 = computeSerializedSizeInWords(segments_01);
  local_40 = (undefined1  [8])(sVar1 << 3);
  kj::heap<kj::VectorOutputStream,unsigned_long>((kj *)(local_40 + 8),(unsigned_long *)local_40);
  segments_00.size_ = (size_t)pAVar2;
  segments_00.ptr = in_R9;
  capnp::writeMessage((capnp *)local_38.ptr,(OutputStream *)segments.size_,segments_00);
  (**(code **)**(undefined8 **)(fds.ptr + 2))
            (local_40,*(undefined8 **)(fds.ptr + 2),*(long *)((long)local_38.ptr + 8),
             *(long *)((long)local_38.ptr + 0x20) - *(long *)((long)local_38.ptr + 8));
  kj::Promise<void>::attach<kj::Own<kj::VectorOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<kj::VectorOutputStream,_std::nullptr_t> *)local_40);
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_40);
  kj::Own<kj::VectorOutputStream,_std::nullptr_t>::dispose
            ((Own<kj::VectorOutputStream,_std::nullptr_t> *)(local_40 + 8));
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> WebSocketMessageStream::writeMessage(
    kj::ArrayPtr<const int> fds,
    kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  // TODO(perf): Right now the WebSocket interface only supports send() for
  // contiguous arrays, so we need to copy the whole message into a new buffer
  // in order to send it, whereas ideally we could just write each segment
  // (and the segment table) in sequence. Perhaps we should extend the WebSocket
  // interface to be able to send an ArrayPtr<ArrayPtr<byte>> as one binary
  // message, and then use that to avoid an extra copy here.

  auto stream = kj::heap<kj::VectorOutputStream>(
      computeSerializedSizeInWords(segments) * sizeof(word));
  capnp::writeMessage(*stream, segments);
  auto arrayPtr = stream->getArray();
  return socket.send(arrayPtr).attach(kj::mv(stream));
}